

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O2

uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
test_uintwide_t_edge::
generate_wide_integer_value<math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>>
          (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>
           *__return_storage_ptr__,test_uintwide_t_edge *this,bool is_positive,
          local_base base_to_get,int digits_in_base_to_get)

{
  char __c;
  result_type rVar1;
  undefined7 in_register_00000011;
  local_base base_to_get_local;
  string str_x;
  
  base_to_get_local = (local_base)CONCAT71(in_register_00000011,is_positive);
  str_x._M_dataplus._M_p = (pointer)&str_x.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&str_x,(long)(int)base_to_get,'0');
  std::
  generate<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,test_uintwide_t_edge::generate_wide_integer_value<math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>>(bool,test_uintwide_t_edge::local_base,int)::_lambda()_1_>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )str_x._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(str_x._M_dataplus._M_p + str_x._M_string_length),
             (anon_class_8_1_a530db20)&base_to_get_local);
  if (base_to_get_local == hex) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (&str_x,(const_iterator)str_x._M_dataplus._M_p,1,'x');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (&str_x,(const_iterator)str_x._M_dataplus._M_p,1,'0');
  }
  else if (base_to_get_local == oct) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (&str_x,(const_iterator)str_x._M_dataplus._M_p,1,'0');
  }
  if (base_to_get_local == dec) {
    __c = '+';
    if ((char)this == '\0') {
      rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&dist_sgn,
                         (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
                          *)eng_sgn);
      __c = (rVar1 == 0) * '\x02' + '+';
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (&str_x,(const_iterator)str_x._M_dataplus._M_p,1,__c);
  }
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  uintwide_t(__return_storage_ptr__,str_x._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&str_x);
  return __return_storage_ptr__;
}

Assistant:

auto generate_wide_integer_value(bool       is_positive           = true,
                                 local_base base_to_get           = local_base::dec,
                                 int        digits_in_base_to_get = std::numeric_limits<IntegralTypeWithStringConstruction>::digits10) -> IntegralTypeWithStringConstruction
{
  using local_integral_type = IntegralTypeWithStringConstruction;

  static_assert(   (  std::numeric_limits<local_integral_type>::is_signed  && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(63)))
                || ((!std::numeric_limits<local_integral_type>::is_signed) && std::numeric_limits<local_integral_type>::digits > static_cast<int>(INT8_C(64))),
                "Error: Integral type destination does not have enough digits10");

  std::string str_x(static_cast<std::size_t>(digits_in_base_to_get), '0');

  std::generate(str_x.begin(),
                str_x.end(),
                [&base_to_get]() // NOLINT(modernize-use-trailing-return-type,-warnings-as-errors)
                {
                  char c { };

                  if(base_to_get == local_base::oct)
                  {
                    c = static_cast<char>(dist_dig_oct(eng_dig));
                    c = static_cast<char>(c + '0');
                  }
                  else if(base_to_get == local_base::hex)
                  {
                    c = static_cast<char>(dist_dig_hex(eng_dig));

                    if(c < static_cast<char>(INT8_C(10)))
                    {
                      c = static_cast<char>(c + '0');
                    }
                    else
                    {
                      c =
                        static_cast<char>
                        (
                            static_cast<char>(c + 'A')
                          - static_cast<char>(INT8_C(10))
                        );
                    }
                  }
                  else
                  {
                    c = static_cast<char>(dist_dig_dec(eng_dig));
                    c = static_cast<char>(c + static_cast<char>(INT8_C(0x30)));
                  }

                  return c;
                });

  if(base_to_get == local_base::oct)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }
  else if(base_to_get == local_base::hex)
  {
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), 'x');
    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), '0');
  }

  if(base_to_get == local_base::dec)
  {
    // Insert either a positive sign or a negative sign
    // (always one or the other) depending on the sign of x.
    const auto sign_char_to_insert =
      static_cast<char>
      (
        is_positive
          ? '+'
          : static_cast<char>((dist_sgn(eng_sgn) != static_cast<std::uint32_t>(UINT32_C(0))) ? '+' : '-') // NOLINT(readability-avoid-nested-conditional-operator)
      );

    str_x.insert(str_x.begin(), static_cast<std::size_t>(UINT8_C(1)), sign_char_to_insert);
  }

  return local_integral_type(str_x.c_str());
}